

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.h
# Opt level: O0

int aom_get_qmlevel_444_chroma(int qindex,int first,int last)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int chroma_qm_level;
  undefined4 local_10;
  
  if (in_EDI < 0xd) {
    local_10 = 10;
  }
  else if (in_EDI < 0x19) {
    local_10 = 9;
  }
  else if (in_EDI < 0x21) {
    local_10 = 8;
  }
  else if (in_EDI < 0x25) {
    local_10 = 7;
  }
  else if (in_EDI < 0x2d) {
    local_10 = 6;
  }
  else if (in_EDI < 0x31) {
    local_10 = 5;
  }
  else if (in_EDI < 0x39) {
    local_10 = 4;
  }
  else if (in_EDI < 0x59) {
    local_10 = 3;
  }
  else {
    local_10 = 2;
  }
  iVar1 = clamp(local_10,in_ESI,in_EDX);
  return iVar1;
}

Assistant:

static inline int aom_get_qmlevel_444_chroma(int qindex, int first, int last) {
  int chroma_qm_level = 0;

  if (qindex <= 12) {
    chroma_qm_level = 10;
  } else if (qindex <= 24) {
    chroma_qm_level = 9;
  } else if (qindex <= 32) {
    chroma_qm_level = 8;
  } else if (qindex <= 36) {
    chroma_qm_level = 7;
  } else if (qindex <= 44) {
    chroma_qm_level = 6;
  } else if (qindex <= 48) {
    chroma_qm_level = 5;
  } else if (qindex <= 56) {
    chroma_qm_level = 4;
  } else if (qindex <= 88) {
    chroma_qm_level = 3;
  } else {
    chroma_qm_level = 2;
  }

  return clamp(chroma_qm_level, first, last);
}